

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
           *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_> *this_00
  ;
  ResponseHook *in_RDX;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
  *result_00;
  undefined1 in_stack_00000008 [24];
  undefined1 local_200 [8];
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_> result;
  WaitScope *waitScope_local;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_> *this_local;
  
  result.value.ptr.field_1.value.hook.ptr = in_RDX;
  kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::
  ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
               *)local_200);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)__stat_loc);
  kj::_::waitImpl(node,(ExceptionOrValue *)local_200,
                  (WaitScope *)result.value.ptr.field_1.value.hook.ptr,
                  (SourceLocation)in_stack_00000008);
  this_00 = mv<kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>>>
                      ((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
                        *)local_200);
  kj::_::
  convertToReturn<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>>
            ((Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults> *)this,
             (_ *)this_00,result_00);
  kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::
  ~ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
                *)local_200);
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}